

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObject.cpp
# Opt level: O3

bool __thiscall GameObject::CheckCollision(GameObject *this,int x,int y,int radius)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (radius < 0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    iVar2 = -radius;
    do {
      iVar3 = 0;
      do {
        if ((iVar2 + (int)this->pos_x == x) && ((y + radius) - (int)this->pos_y == iVar3)) {
          return bVar1;
        }
        iVar3 = iVar3 + 1;
      } while (radius * 2 + 1 != iVar3);
      bVar4 = iVar2 != radius;
      bVar1 = iVar2 < radius;
      iVar2 = iVar2 + 1;
    } while (bVar4);
  }
  return bVar1;
}

Assistant:

bool GameObject::CheckCollision(int x, int y, int radius)
{

  //is pos X or pos Y inside the point/radius?
for(int i=-radius;i<=radius;i++)
  { 
    for(int j=-radius;j<=radius;j++)
    { 

      if((static_cast<int>(pos_x)+i ==  x) && (static_cast<int>(pos_y)+j == y))
      {
        return true;
      }
    }

  } 
/*   if(static_cast<int>(pos_x) ==  x && static_cast<int>(pos_y) == y) ||
      {
        return true;
      }
 */     
  return false;

}